

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
pbrt::GBufferFilm::WriteImage(GBufferFilm *this,ImageMetadata *metadata,Float splatScale)

{
  Image *in_RSI;
  long in_RDI;
  Image image;
  ImageMetadata *in_stack_00000b30;
  string *in_stack_00000b38;
  Image *in_stack_00000b40;
  Float in_stack_00000fac;
  ImageMetadata *in_stack_00000fb0;
  GBufferFilm *in_stack_00000fb8;
  string local_e0 [40];
  Bounds2<int> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  LogLevel in_stack_ffffffffffffff74;
  
  GetImage(in_stack_00000fb8,in_stack_00000fb0,in_stack_00000fac);
  if (logging::logLevel < 1) {
    Log<std::__cxx11::string&,pbrt::Bounds2<int>&>
              (in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  std::__cxx11::string::string(local_e0,(string *)(in_RDI + 0x30));
  Image::Write(in_stack_00000b40,in_stack_00000b38,in_stack_00000b30);
  std::__cxx11::string::~string(local_e0);
  Image::~Image(in_RSI);
  return;
}

Assistant:

void GBufferFilm::WriteImage(ImageMetadata metadata, Float splatScale) {
    Image image = GetImage(&metadata, splatScale);
    LOG_VERBOSE("Writing image %s with bounds %s", filename, pixelBounds);
    image.Write(filename, metadata);
}